

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TexSubImageCubeBufferCase::createTexture(TexSubImageCubeBufferCase *this)

{
  ContextWrapper *pCVar1;
  TextureFormat *this_00;
  float fVar2;
  float fVar3;
  float fVar4;
  deUint32 seed;
  int iVar5;
  TransferFormat TVar6;
  int iVar7;
  int face;
  long lVar8;
  uint rowPitch;
  int ndx;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  deUint32 buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  ContextWrapper *local_a0;
  TextureFormat *local_98;
  ulong local_90;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  PixelBufferAccess local_58;
  
  seed = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                      super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  this_00 = &(this->super_TextureCubeSpecCase).m_texFormat;
  TVar6 = glu::getTransferFormat((this->super_TextureCubeSpecCase).m_texFormat);
  local_98 = this_00;
  iVar5 = tcu::TextureFormat::getPixelSize(this_00);
  tex = 0;
  buf = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar1 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(pCVar1,1,&tex);
  sglr::ContextWrapper::glBindTexture(pCVar1,0x8513,tex);
  iVar7 = (this->super_TextureCubeSpecCase).m_size;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)((iVar7 * iVar5 + 3U & 0xfffffffc) * iVar7));
  sglr::ContextWrapper::glPixelStorei(pCVar1,0xcf5,1);
  local_90 = (ulong)TVar6 >> 0x20;
  lVar8 = 0;
  local_a0 = pCVar1;
  do {
    gMin.m_data[0] = 0.0;
    gMin.m_data[1] = 0.0;
    gMin.m_data[2] = 0.0;
    gMin.m_data[3] = 0.0;
    lVar9 = 0;
    do {
      fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar9];
      fVar3 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar9];
      fVar10 = deRandom_getFloat(&rnd.m_rnd);
      gMin.m_data[lVar9] = (fVar3 - fVar2) * fVar10 + fVar2;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    gMax.m_data[0] = 0.0;
    gMax.m_data[1] = 0.0;
    gMax.m_data[2] = 0.0;
    gMax.m_data[3] = 0.0;
    lVar9 = 0;
    do {
      fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[lVar9];
      fVar3 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[lVar9];
      fVar10 = deRandom_getFloat(&rnd.m_rnd);
      gMax.m_data[lVar9] = (fVar3 - fVar2) * fVar10 + fVar2;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    iVar7 = (this->super_TextureCubeSpecCase).m_size;
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_58,local_98,iVar7,iVar7,1,iVar7 * iVar5 + 3U & 0xfffffffc,0,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
    iVar7 = (this->super_TextureCubeSpecCase).m_size;
    sglr::ContextWrapper::glTexImage2D
              (local_a0,(&s_cubeMapFaces)[lVar8],0,this->m_internalFormat,iVar7,iVar7,0,TVar6.format
               ,(deUint32)local_90,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  iVar7 = this->m_rowLength;
  if (iVar7 < 1) {
    iVar7 = this->m_subW;
  }
  fVar2 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[0];
  fVar3 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[1];
  fVar10 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[2];
  fVar4 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin.m_data[3];
  fVar11 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[0] - fVar2;
  fVar12 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[1] - fVar3;
  fVar13 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[2] - fVar10;
  fVar14 = (this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax.m_data[3] - fVar4;
  rowPitch = (this->m_alignment + iVar7 * iVar5) - 1U & -this->m_alignment;
  gMin.m_data[1] = fVar12 * 0.0 + fVar3;
  gMin.m_data[0] = fVar11 * 1.0 + fVar2;
  gMin.m_data[3] = fVar14 * 1.0 + fVar4;
  gMin.m_data[2] = fVar13 * 0.0 + fVar10;
  gMax.m_data[1] = fVar12 * 1.0 + fVar3;
  gMax.m_data[0] = fVar11 * 0.0 + fVar2;
  gMax.m_data[3] = fVar14 * 1.0 + fVar4;
  gMax.m_data[2] = fVar13 * 0.0 + fVar10;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)((this->m_skipRows + this->m_subH) * rowPitch + this->m_offset));
  pCVar1 = local_a0;
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,local_98,this->m_subW,this->m_subH,1,rowPitch,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)this->m_offset + (long)(this->m_skipPixels * iVar5) +
             (long)(int)(this->m_skipRows * rowPitch));
  tcu::fillWithGrid(&local_58,4,&gMin,&gMax);
  sglr::ContextWrapper::glGenBuffers(pCVar1,1,&buf);
  sglr::ContextWrapper::glBindBuffer(pCVar1,0x88ec,buf);
  sglr::ContextWrapper::glBufferData
            (pCVar1,0x88ec,
             (long)((int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  sglr::ContextWrapper::glPixelStorei(pCVar1,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(pCVar1,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(pCVar1,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(pCVar1,0xcf5,this->m_alignment);
  lVar8 = 0;
  do {
    sglr::ContextWrapper::glTexSubImage2D
              (pCVar1,*(deUint32 *)((long)&s_cubeMapFaces + lVar8),0,this->m_subX,this->m_subY,
               this->m_subW,this->m_subH,TVar6.format,(deUint32)local_90,
               (void *)(long)this->m_offset);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x18);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		de::Random				rnd				(deStringHash(getName()));
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		// Fill faces with different gradients.

		data.resize(deAlign32(m_size*pixelSize, 4)*m_size);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
		{
			const Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			const Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, 1, deAlign32(m_size*pixelSize, 4), 0, &data[0]), gMin, gMax);

			glTexImage2D(s_cubeMapFaces[face], 0, m_internalFormat, m_size, m_size, 0, transferFmt.format, transferFmt.dataType, &data[0]);
		}

		// Fill data with grid.
		{
			int		rowLength	= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch	= deAlign32(rowLength*pixelSize, m_alignment);
			int		height		= m_subH + m_skipRows;
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(rowPitch*height + m_offset);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER,	buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER,	(int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			glTexSubImage2D(s_cubeMapFaces[face], 0, m_subX, m_subY, m_subW, m_subH, transferFmt.format, transferFmt.dataType, (const void*)(deUintptr)m_offset);
	}